

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyJson
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  char *__begin2;
  ulong uVar4;
  int iVar5;
  
  if (prefix.size_ != 0) {
    sVar3 = 0;
    iVar5 = 0;
    do {
      bVar1 = prefix.ptr[sVar3];
      uVar4 = (ulong)bVar1;
      if (iVar5 == 2) {
        if (bVar1 == 0x22) {
          return PLAUSIBLE;
        }
LAB_0012013b:
        if ((((bVar1 & 0xfb) != 9 && bVar1 != 10) && (byte)(bVar1 - 1) < 0x1f) && bVar1 != 0xb) {
          return IMPOSSIBLE;
        }
        iVar2 = iVar5;
        if (bVar1 == 0x7f) {
          return IMPOSSIBLE;
        }
      }
      else if (iVar5 == 1) {
        iVar2 = 0;
        if (bVar1 != 10) goto LAB_0012013b;
      }
      else {
        if (bVar1 < 0x30) {
          if ((0x100002e00U >> (uVar4 & 0x3f) & 1) != 0) goto LAB_0012013b;
          if ((uVar4 == 0x23) || (uVar4 == 0x2f)) {
            iVar2 = 1;
            goto LAB_00120179;
          }
        }
        iVar2 = 2;
        if (bVar1 != 0x7b) {
          return IMPOSSIBLE;
        }
      }
LAB_00120179:
      iVar5 = iVar2;
      sVar3 = sVar3 + 1;
    } while (prefix.size_ != sVar3);
  }
  return PLAUSIBLE;
}

Assistant:

Plausibility isPlausiblyJson(kj::ArrayPtr<const byte> prefix) {
    enum { PREAMBLE, COMMENT, BODY } state = PREAMBLE;

    for (char c: prefix.asChars()) {
      switch (state) {
        case PREAMBLE:
          // Before opening parenthesis.
          switch (c) {
            case '{': state = BODY; continue;
            case '#': state = COMMENT; continue;
            case '/': state = COMMENT; continue;
            case ' ':
            case '\n':
            case '\r':
            case '\t':
            case '\v':
              // whitespace
              break;
            default:
              // Not whitespace, not comment, not open brace. Impossible!
              return IMPOSSIBLE;
          }
          break;
        case COMMENT:
          switch (c) {
            case '\n': state = PREAMBLE; continue;
            default: break;
          }
          break;
        case BODY:
          switch (c) {
            case '\"':
              // String literal. Let's stop here before things get complicated.
              return PLAUSIBLE;
            default:
              break;
          }
          break;
      }

      if ((c > 0 && c < ' ' && c != '\n' && c != '\r' && c != '\t' && c != '\v') || c == 0x7f) {
        // Unprintable character.
        return IMPOSSIBLE;
      }
    }

    return PLAUSIBLE;
  }